

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O3

shared_ptr<helics::Broker> helics::BrokerFactory::getConnectedBroker(void)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  SearchableObjectHolder<helics::Broker,_helics::CoreType> *in_RDI;
  shared_ptr<helics::Broker> sVar2;
  undefined8 local_28;
  undefined8 uStack_20;
  code *local_18;
  code *local_10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  local_28 = 0;
  uStack_20 = 0;
  local_10 = std::
             _Function_handler<bool_(const_std::shared_ptr<helics::Broker>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerFactory.cpp:237:41)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<bool_(const_std::shared_ptr<helics::Broker>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerFactory.cpp:237:41)>
             ::_M_manager;
  sVar2 = gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::findObject
                    (in_RDI,(function<bool_(const_std::shared_ptr<helics::Broker>_&)> *)
                            searchableBrokers);
  _Var1 = sVar2.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,3);
    _Var1._M_pi = extraout_RDX;
  }
  sVar2.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<helics::Broker>)
         sVar2.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Broker> getConnectedBroker()
{
    return searchableBrokers.findObject([](auto& ptr) { return ptr->isConnected(); });
}